

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O2

void __thiscall
spatial_region::fout_irho_yzplane
          (spatial_region *this,int ion_type,ofstream *pfout,int i,openmode mode)

{
  ostream *poVar1;
  int j;
  long lVar2;
  int k;
  long lVar3;
  
  if ((mode & ~_S_app) == (_S_out|_S_bin)) {
    write_binary_yzplane<double>
              (pfout,(this->irho).
                     super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
                     super__Vector_impl_data._M_start + ion_type,getdouble,i,this->ny,this->nz);
    return;
  }
  if ((mode & ~_S_app) == _S_out) {
    for (lVar2 = 0; lVar2 < this->ny; lVar2 = lVar2 + 1) {
      for (lVar3 = 0; lVar3 < this->nz; lVar3 = lVar3 + 1) {
        poVar1 = std::ostream::_M_insert<double>
                           (*(double *)
                             (*(long *)(*(long *)((long)(this->irho).
                                                                                                                
                                                  super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [ion_type].p._M_t.
                                                  super___uniq_ptr_impl<double_**,_std::default_delete<double_**[]>_>
                                                  ._M_t + (long)i * 8) + lVar2 * 8) + lVar3 * 8));
        std::operator<<(poVar1,"\n");
      }
    }
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"fout_irho_yzplane: ERROR: wrong mode");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void spatial_region::fout_irho_yzplane(int ion_type, ofstream* pfout, int i,
        ios_base::openmode mode)
{
    if (is_mode_non_binary(mode)) {
        for(int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++) {
                (*pfout)<<irho[ion_type][i][j][k]<<"\n";
            }
        }
    } else if (is_mode_binary(mode)) {
        write_binary_yzplane<double>(pfout, irho[ion_type], getdouble, i, ny,
                nz);
    } else {
        cerr << "fout_irho_yzplane: ERROR: wrong mode" << endl;
    }
}